

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O2

void __thiscall Version_versionMatch_Test::TestBody(Version_versionMatch_Test *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertHelper local_50 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_38 [12];
  uint version;
  string versionString;
  
  version = libcellml::version();
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 6;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((AssertionResult *)&versionString,(internal *)"0x000603U","version",
             &gtest_ar_1.success_,&version,(uint *)in_R9);
  if ((char)versionString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (versionString._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)versionString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,8,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&versionString._M_string_length);
  libcellml::versionString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (&gtest_ar_1,(internal *)"\"0.6.3\"","versionString","0.6.3",
             (char (*) [6])&versionString,in_R9);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_50);
    if (gtest_ar_1._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,0xb,pcVar1);
    testing::internal::AssertHelper::operator=(local_38,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&versionString);
  return;
}

Assistant:

TEST(Version, versionMatch)
{
    unsigned int version = libcellml::version();
    EXPECT_EQ(0x000603U, version);

    std::string versionString = libcellml::versionString();
    EXPECT_EQ("0.6.3", versionString);
}